

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeVirtualMemGetAccessAttribute
          (ze_context_handle_t hContext,void *ptr,size_t size,ze_memory_access_attribute_t *access,
          size_t *outSize)

{
  ze_result_t zVar1;
  
  if (DAT_0010e6f0 != (code *)0x0) {
    zVar1 = (*DAT_0010e6f0)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeVirtualMemGetAccessAttribute(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] pointer to start of virtual address region for query.
        size_t size,                                    ///< [in] size in bytes; must be page aligned.
        ze_memory_access_attribute_t* access,           ///< [out] query result for page access attribute.
        size_t* outSize                                 ///< [out] query result for size of virtual address range, starting at ptr,
                                                        ///< that shares same access attribute.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetAccessAttribute = context.zeDdiTable.VirtualMem.pfnGetAccessAttribute;
        if( nullptr != pfnGetAccessAttribute )
        {
            result = pfnGetAccessAttribute( hContext, ptr, size, access, outSize );
        }
        else
        {
            // generic implementation
        }

        return result;
    }